

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::SetupOtherInputs(VersionSet *this,Compaction *c)

{
  bool bVar1;
  Slice *pSVar2;
  InternalKey *pIVar3;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *pvVar4;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs2;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *pvVar5;
  int64_t iVar6;
  InternalKey *largest_00;
  InternalKey *pIVar7;
  size_type sVar8;
  size_type sVar9;
  undefined4 uVar10;
  Compaction *in_RSI;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *in_RDI;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> expanded1;
  InternalKey new_limit;
  InternalKey new_start;
  int64_t expanded0_size;
  int64_t inputs1_size;
  int64_t inputs0_size;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> expanded0;
  InternalKey all_limit;
  InternalKey all_start;
  InternalKey largest;
  InternalKey smallest;
  int level;
  undefined4 in_stack_fffffffffffffe44;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
  *in_stack_fffffffffffffe50;
  InternalKey *in_stack_fffffffffffffe58;
  FileMetaData *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  uint in_stack_fffffffffffffe6c;
  uint in_stack_fffffffffffffe70;
  uint in_stack_fffffffffffffe74;
  Slice *in_stack_fffffffffffffe78;
  InternalKey *in_stack_fffffffffffffe80;
  InternalKey *in_stack_fffffffffffffe88;
  _Alloc_hider *smallest_00;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
  *in_stack_fffffffffffffe90;
  VersionSet *in_stack_fffffffffffffea0;
  string local_150 [16];
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
  *in_stack_fffffffffffffec0;
  InternalKey *in_stack_fffffffffffffec8;
  InternalKey *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  Version *in_stack_fffffffffffffee0;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> local_c0 [6];
  uint local_24;
  Compaction *local_20;
  
  local_20 = in_RSI;
  local_24 = Compaction::level(in_RSI);
  InternalKey::InternalKey((InternalKey *)0x12cae8);
  InternalKey::InternalKey((InternalKey *)0x12caf5);
  AddBoundaryInputs((InternalKeyComparator *)
                    CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                    (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                    CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                    (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                    in_stack_fffffffffffffe60);
  GetRange((VersionSet *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
           (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
           CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
           (InternalKey *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Version::GetOverlappingInputs
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  InternalKey::InternalKey((InternalKey *)0x12cba3);
  InternalKey::InternalKey((InternalKey *)0x12cbb0);
  GetRange2(in_stack_fffffffffffffea0,in_RDI,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
            in_stack_fffffffffffffe80);
  bVar1 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                    (in_stack_fffffffffffffe50);
  if (!bVar1) {
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)0x12cc19
              );
    Version::GetOverlappingInputs
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    AddBoundaryInputs((InternalKeyComparator *)
                      CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                      (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                      CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                      (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                      in_stack_fffffffffffffe60);
    pSVar2 = (Slice *)TotalFileSize(in_stack_fffffffffffffe50);
    pIVar3 = (InternalKey *)TotalFileSize(in_stack_fffffffffffffe50);
    pvVar4 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
             TotalFileSize(in_stack_fffffffffffffe50);
    inputs2 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
              std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                        (local_c0);
    pvVar5 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
             std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                       (local_20->inputs_);
    if (pvVar5 < inputs2) {
      smallest_00 = &(pIVar3->rep_)._M_dataplus +
                    (long)&(pvVar4->
                           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           )._M_impl;
      iVar6 = ExpandedCompactionByteSizeLimit((Options *)0x12cd27);
      if ((long)smallest_00 < iVar6) {
        InternalKey::InternalKey((InternalKey *)0x12cd45);
        InternalKey::InternalKey((InternalKey *)0x12cd52);
        GetRange((VersionSet *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                 (InternalKey *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
                  ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   0x12cd81);
        Version::GetOverlappingInputs
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,
                   in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
        largest_00 = (InternalKey *)
                     std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ::size((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                             *)&stack0xfffffffffffffed0);
        pIVar7 = (InternalKey *)
                 std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                 size(local_20->inputs_ + 1);
        if (largest_00 == pIVar7) {
          in_stack_fffffffffffffe60 =
               in_RDI[1].
               super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage[3];
          in_stack_fffffffffffffe6c = local_24;
          sVar8 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  size(local_20->inputs_);
          in_stack_fffffffffffffe70 = (uint)sVar8;
          sVar8 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  size(local_20->inputs_ + 1);
          in_stack_fffffffffffffe74 = (uint)sVar8;
          sVar8 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  size(local_c0);
          sVar9 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  size((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       &stack0xfffffffffffffed0);
          uVar10 = (undefined4)sVar8;
          Log((Logger *)in_stack_fffffffffffffe60,
              "Expanding@%d %d+%d (%ld+%ld bytes) to %d+%d (%ld+%ld bytes)\n",
              (ulong)in_stack_fffffffffffffe6c,(ulong)in_stack_fffffffffffffe70,
              (ulong)in_stack_fffffffffffffe74,pSVar2,pIVar3,uVar10,(int)sVar9,pvVar4,pIVar3);
          InternalKey::operator=((InternalKey *)CONCAT44(in_stack_fffffffffffffe44,uVar10),pIVar3);
          InternalKey::operator=((InternalKey *)CONCAT44(in_stack_fffffffffffffe44,uVar10),pIVar3);
          std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator=
                    ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     in_stack_fffffffffffffee0,
                     (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator=
                    ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     in_stack_fffffffffffffee0,
                     (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          GetRange2(in_stack_fffffffffffffea0,in_RDI,inputs2,(InternalKey *)smallest_00,largest_00);
          in_stack_fffffffffffffe50 = pvVar4;
          in_stack_fffffffffffffe78 = pSVar2;
        }
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
                  (in_stack_fffffffffffffe50);
        InternalKey::~InternalKey((InternalKey *)0x12cf7c);
        InternalKey::~InternalKey((InternalKey *)0x12cf89);
      }
    }
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
              (in_stack_fffffffffffffe50);
  }
  if ((int)(local_24 + 2) < 7) {
    Version::GetOverlappingInputs
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  }
  InternalKey::Encode((InternalKey *)0x12cfec);
  Slice::ToString_abi_cxx11_(in_stack_fffffffffffffe78);
  std::__cxx11::string::operator=
            ((string *)((long)in_RDI + (long)(int)local_24 * 0x20 + 0x170),local_150);
  std::__cxx11::string::~string(local_150);
  VersionEdit::SetCompactPointer
            ((VersionEdit *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             in_stack_fffffffffffffe6c,(InternalKey *)in_stack_fffffffffffffe60);
  InternalKey::~InternalKey((InternalKey *)0x12d061);
  InternalKey::~InternalKey((InternalKey *)0x12d06e);
  InternalKey::~InternalKey((InternalKey *)0x12d07b);
  InternalKey::~InternalKey((InternalKey *)0x12d088);
  return;
}

Assistant:

void VersionSet::SetupOtherInputs(Compaction* c) {
  const int level = c->level();
  InternalKey smallest, largest;

  AddBoundaryInputs(icmp_, current_->files_[level], &c->inputs_[0]);
  GetRange(c->inputs_[0], &smallest, &largest);

  current_->GetOverlappingInputs(level + 1, &smallest, &largest,
                                 &c->inputs_[1]);

  // Get entire range covered by compaction
  InternalKey all_start, all_limit;
  GetRange2(c->inputs_[0], c->inputs_[1], &all_start, &all_limit);

  // See if we can grow the number of inputs in "level" without
  // changing the number of "level+1" files we pick up.
  if (!c->inputs_[1].empty()) {
    std::vector<FileMetaData*> expanded0;
    current_->GetOverlappingInputs(level, &all_start, &all_limit, &expanded0);
    AddBoundaryInputs(icmp_, current_->files_[level], &expanded0);
    const int64_t inputs0_size = TotalFileSize(c->inputs_[0]);
    const int64_t inputs1_size = TotalFileSize(c->inputs_[1]);
    const int64_t expanded0_size = TotalFileSize(expanded0);
    if (expanded0.size() > c->inputs_[0].size() &&
        inputs1_size + expanded0_size <
            ExpandedCompactionByteSizeLimit(options_)) {
      InternalKey new_start, new_limit;
      GetRange(expanded0, &new_start, &new_limit);
      std::vector<FileMetaData*> expanded1;
      current_->GetOverlappingInputs(level + 1, &new_start, &new_limit,
                                     &expanded1);
      if (expanded1.size() == c->inputs_[1].size()) {
        Log(options_->info_log,
            "Expanding@%d %d+%d (%ld+%ld bytes) to %d+%d (%ld+%ld bytes)\n",
            level, int(c->inputs_[0].size()), int(c->inputs_[1].size()),
            long(inputs0_size), long(inputs1_size), int(expanded0.size()),
            int(expanded1.size()), long(expanded0_size), long(inputs1_size));
        smallest = new_start;
        largest = new_limit;
        c->inputs_[0] = expanded0;
        c->inputs_[1] = expanded1;
        GetRange2(c->inputs_[0], c->inputs_[1], &all_start, &all_limit);
      }
    }
  }

  // Compute the set of grandparent files that overlap this compaction
  // (parent == level+1; grandparent == level+2)
  if (level + 2 < config::kNumLevels) {
    current_->GetOverlappingInputs(level + 2, &all_start, &all_limit,
                                   &c->grandparents_);
  }

  // Update the place where we will do the next compaction for this level.
  // We update this immediately instead of waiting for the VersionEdit
  // to be applied so that if the compaction fails, we will try a different
  // key range next time.
  compact_pointer_[level] = largest.Encode().ToString();
  c->edit_.SetCompactPointer(level, largest);
}